

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

void do_const_prop(dill_stream c,basic_block_conflict bb,virtual_insn *insns,int loc)

{
  long lVar1;
  virtual_insn *insn;
  vreg_info *pvVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  virtual_insn *pvVar7;
  basic_block_conflict pbVar8;
  int in_R8D;
  
  insn = insns + loc;
  if (insn->class_code == '\t') {
    iVar4 = (insn->opnds).a3.src1;
    lVar6 = (long)iVar4;
    if (((99 < lVar6) && (pvVar2 = c->p->vregs, pvVar2[lVar6 + -100].use_info.use_count == 1)) &&
       (pvVar2[lVar6 + -100].use_info.def_count == 1)) {
      iVar5 = (insn->opnds).a3.dest;
      pbVar8 = bb;
      if (c->dill_debug != 0) {
        printf(" mov propagating    ");
        virtual_print_insn(c,pbVar8,insn);
        putchar(10);
      }
      lVar6 = (long)(loc + -1);
      if (bb->start < lVar6) {
        pvVar7 = insns + lVar6;
        bVar3 = false;
        do {
          lVar6 = lVar6 + -1;
          switch(pvVar7->class_code) {
          case '\0':
          case '\x01':
          case '\x02':
          case '\x04':
          case '\t':
            if ((pvVar7->opnds).a3.dest == iVar4) {
              if (c->dill_debug != 0) {
                printf("   Replacing  ");
                virtual_print_insn(c,pbVar8,pvVar7);
                printf(" with ");
              }
              (pvVar7->opnds).a3.dest = iVar5;
LAB_00111818:
              if (c->dill_debug != 0) {
                virtual_print_insn(c,pbVar8,pvVar7);
                putchar(10);
              }
              insn->class_code = '\x18';
              pbVar8 = bb;
              set_unused(c,bb,iVar4);
              bVar3 = true;
            }
            break;
          case '\x05':
            if (((pvVar7->insn_code & 0x10U) == 0) && ((pvVar7->opnds).a3.dest == iVar4)) {
              if (c->dill_debug != 0) {
                printf("   Replacing  ");
                virtual_print_insn(c,pbVar8,pvVar7);
                printf(" with ");
              }
              (pvVar7->opnds).a3.dest = iVar4;
              goto LAB_00111818;
            }
          }
        } while ((bb->start < lVar6) && (pvVar7 = pvVar7 + -1, !bVar3));
      }
    }
  }
  else if (insn->class_code == '\a') {
    lVar6 = (long)(insn->opnds).a3.dest;
    if (((lVar6 < 100) || (pvVar2 = c->p->vregs, pvVar2[lVar6 + -100].use_info.use_count != 1)) ||
       (pvVar2[lVar6 + -100].use_info.def_count != 1)) {
      pbVar8 = bb;
      iVar4 = insn_defines(insn);
      if (c->dill_debug != 0) {
        printf(" Forward propagating const    ");
        virtual_print_insn(c,pbVar8,insn);
        putchar(10);
      }
      lVar6 = (long)(loc + 1);
      if (lVar6 <= bb->end) {
        pvVar7 = insns + lVar6;
        do {
          iVar5 = insn_defines(pvVar7);
          if (iVar4 == iVar5) break;
          const_prop_ip(c,bb,pvVar7,insn,in_R8D);
          lVar1 = lVar6 + 1;
          pvVar7 = pvVar7 + 1;
          bVar3 = lVar6 < bb->end;
          lVar6 = lVar1;
        } while (bVar3);
      }
      if (lVar6 <= bb->end) {
        const_prop_ip(c,bb,insns + lVar6,insn,in_R8D);
        return;
      }
    }
    else {
      if (c->dill_debug != 0) {
        pbVar8 = bb;
        printf(" Forward propagating    ");
        virtual_print_insn(c,pbVar8,insn);
        putchar(10);
      }
      lVar6 = (long)(loc + 1);
      if (lVar6 <= bb->end) {
        pvVar7 = insns + lVar6;
        do {
          iVar4 = const_prop_ip(c,bb,pvVar7,insn,in_R8D);
          if (bb->end <= lVar6) {
            return;
          }
          lVar6 = lVar6 + 1;
          pvVar7 = pvVar7 + 1;
        } while (iVar4 == 0);
      }
    }
  }
  return;
}

Assistant:

static void
do_const_prop(dill_stream c, basic_block bb, virtual_insn* insns, int loc)
{
    virtual_insn* set_ip = &((virtual_insn*)insns)[loc];
    if ((set_ip->class_code == iclass_set) &&
        has_single_def_use(c, set_ip->opnds.a3i.dest)) {
        int found = 0;
        int k;

        if (c->dill_debug) {
            printf(" Forward propagating    ");
            virtual_print_insn(c, NULL, set_ip);
            printf("\n");
        }
        for (k = loc + 1; ((k <= bb->end) && (!found)); k++) {
            virtual_insn* ip = &((virtual_insn*)insns)[k];
            found = const_prop_ip(c, bb, ip, set_ip, 1);
        }
    } else if (set_ip->class_code == iclass_set) {
        int k;
        int vdest = insn_defines(set_ip);
        if (c->dill_debug) {
            printf(" Forward propagating const    ");
            virtual_print_insn(c, NULL, set_ip);
            printf("\n");
        }
        for (k = loc + 1; ((k <= bb->end) &&
                           (vdest != insn_defines(&((virtual_insn*)insns)[k])));
             k++) {
            virtual_insn* ip = &((virtual_insn*)insns)[k];
            const_prop_ip(c, bb, ip, set_ip, 0);
        }
        if (k <= bb->end) {
            /* if we ended in insn_defines, substitute the one that defines it
             */
            const_prop_ip(c, bb, &((virtual_insn*)insns)[k], set_ip, 0);
        }
    } else if (((set_ip->class_code == iclass_mov) ||
                ((set_ip->class_code == iclass_convert) &&
                 is_convert_noop(set_ip->insn_code))) &&
               has_single_def_use(c, set_ip->opnds.a2.src)) {
        /* back propagate move */
        int mov_src = set_ip->opnds.a2.src;
        int mov_dest = set_ip->opnds.a2.dest;
        int found = 0;
        int k;

        if (c->dill_debug) {
            printf(" mov propagating    ");
            virtual_print_insn(c, NULL, set_ip);
            printf("\n");
        }
        for (k = loc - 1; ((k > bb->start) && (!found)); k--) {
            virtual_insn* ip = &((virtual_insn*)insns)[k];
            switch (ip->class_code) {
            case iclass_arith3: {
                /* arith 3 operand integer insns */
                int dest_vreg = ip->opnds.a3.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a3i.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_arith2: {
                /* arith 2 operand integer insns */
                int dest_vreg = ip->opnds.a2.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a2.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
                break;
            }
            case iclass_arith3i: {
                /* arith 3 immediate operand integer insns */
                int dest_vreg = ip->opnds.a3i.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a3i.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_ret:
                break;
            case iclass_convert: {
                /* conversion insns */
                int dest_vreg = ip->opnds.a2.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a2.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_loadstore: {
                int store = ((ip->insn_code & 0x10) == 0x10);
                /* load/store 3 operand integer insns */
                int dest_vreg = ip->opnds.a3.dest;

                if (!store && (dest_vreg == mov_src)) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a3i.dest = mov_src;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_loadstorei:
                break;
            case iclass_lea:
                break;
            case iclass_set:
                break;
            case iclass_setf:
                break;
            case iclass_mov: {
                /* mov insns */
                int dest_vreg = ip->opnds.a2.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a2.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_reti:
            case iclass_branch:
            case iclass_branchi:
            case iclass_compare:
            case iclass_jump_to_label:
            case iclass_jump_to_reg:
            case iclass_jump_to_imm:
            case iclass_special:
            case iclass_call:
            case iclass_push:
            case iclass_pushi:
            case iclass_pushf:
            case iclass_nop:
            case iclass_mark_label:
                break;
            }
        }
    }
}